

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

FeatureType __thiscall
CoreML::FeatureType::Array
          (FeatureType *this,vector<long,_std::allocator<long>_> *shape,MLArrayDataType dataType)

{
  int64 *piVar1;
  ArrayFeatureType *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  int64 *piVar3;
  FeatureType FVar4;
  
  FeatureType(this,MLFeatureTypeType_multiArrayType);
  this_00 = Specification::FeatureType::mutable_multiarraytype
                      ((this->m_type).
                       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  piVar1 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  _Var2._M_pi = extraout_RDX;
  for (piVar3 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    Specification::ArrayFeatureType::add_shape(this_00,*piVar3);
    _Var2._M_pi = extraout_RDX_00;
  }
  this_00->datatype_ = dataType;
  FVar4.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  FVar4.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar4.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Array(const std::vector<int64_t> shape, MLArrayDataType dataType) {
        FeatureType out(MLFeatureTypeType_multiArrayType);
        Specification::ArrayFeatureType *params = out->mutable_multiarraytype();
        
        for (int64_t s : shape) {
            params->add_shape(s);
        }
        params->set_datatype(static_cast<Specification::ArrayFeatureType::ArrayDataType>(dataType));
        return out;
    }